

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVirtualProtocol.h
# Opt level: O0

uint32_t __thiscall
duckdb_apache::thrift::protocol::
TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
::readBool_virt(TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
                *this,bool *value)

{
  uint32_t uVar1;
  bool *in_RSI;
  TCompactProtocolT<duckdb::SimpleReadTransport> *in_RDI;
  
  uVar1 = TCompactProtocolT<duckdb::SimpleReadTransport>::readBool(in_RDI,in_RSI);
  return uVar1;
}

Assistant:

uint32_t readBool_virt(bool& value) override {
    return static_cast<Protocol_*>(this)->readBool(value);
  }